

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

int64_t benchmark::anon_unknown_1::EstimateCyclesPerSecond(void)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  int64_t start_ticks;
  uint64_t high_1;
  uint64_t low_1;
  uint64_t high;
  uint64_t low;
  
  uVar1 = rdtsc();
  SleepForMilliseconds(1000);
  uVar2 = rdtsc();
  return (uVar2 & 0xffffffff00000000 | CONCAT44(extraout_var,(int)uVar2)) -
         (uVar1 & 0xffffffff00000000 | CONCAT44((int)((ulong)in_RAX >> 0x20),(int)uVar1));
}

Assistant:

int64_t EstimateCyclesPerSecond() {
  const int64_t start_ticks = cycleclock::Now();
  SleepForMilliseconds(estimate_time_ms);
  return cycleclock::Now() - start_ticks;
}